

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileBindData::Serialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  Value *pVVar1;
  FunctionData *pFVar2;
  QuantileValue *q;
  Value *__args;
  vector<duckdb::Value,_true> raw;
  optional_ptr<duckdb::FunctionData,_true> bind_data_p_local;
  
  bind_data_p_local = bind_data_p;
  pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&bind_data_p_local);
  raw.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  raw.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  raw.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pVVar1 = (Value *)pFVar2[2]._vptr_FunctionData;
  for (__args = (Value *)pFVar2[1]._vptr_FunctionData; __args != pVVar1;
      __args = (Value *)((long)&__args[1].value_ + 8)) {
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<duckdb::Value_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&raw,__args);
  }
  Serializer::WriteProperty<duckdb::vector<duckdb::Value,true>>(serializer,100,"quantiles",&raw);
  Serializer::WriteProperty<duckdb::vector<unsigned_long,true>>
            (serializer,0x65,"order",(vector<unsigned_long,_true> *)(pFVar2 + 4));
  Serializer::WriteProperty<bool>(serializer,0x66,"desc",(bool *)(pFVar2 + 7));
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&raw);
  return;
}

Assistant:

void QuantileBindData::Serialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                                 const AggregateFunction &function) {
	auto &bind_data = bind_data_p->Cast<QuantileBindData>();
	vector<Value> raw;
	for (const auto &q : bind_data.quantiles) {
		raw.emplace_back(q.val);
	}
	serializer.WriteProperty(100, "quantiles", raw);
	serializer.WriteProperty(101, "order", bind_data.order);
	serializer.WriteProperty(102, "desc", bind_data.desc);
}